

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_zeroing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  node_ptr plVar4;
  node_ptr plVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pool<boost::default_user_allocator_malloc_free> *ppVar14;
  pointer p;
  _Hash_node_base *p_Var15;
  ulong uVar16;
  pointer p_1;
  pointer p_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
  m;
  shared_count sStack_430;
  char *local_428;
  char *local_420;
  undefined **local_418;
  undefined1 local_410;
  undefined8 *local_408;
  char **local_400;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_3f8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  pool<boost::default_user_allocator_malloc_free> *local_2c0;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
  local_2b8;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>
            ();
  local_2c0 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_2c0->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_2c0->list).ptr = (char *)0x0;
  (local_2c0->list).sz = 0;
  local_2c0->requested_size = 0x18;
  local_2c0->next_size = 0x20;
  local_2c0->start_size = 0x20;
  local_2c0->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
              *)&local_2b8,&local_3f8,(Column_settings *)local_2c0);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d0,0x26d);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var2 = p_Var2->_M_nxt;
      if ((p_Var2 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar16))
      goto LAB_00133520;
    }
    if (local_2b8.reducedMatrixR_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
        .indexToRow_._M_h._M_buckets
        [local_2b8.reducedMatrixR_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_2b8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               .indexToRow_._M_h._M_buckets
               [local_2b8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x00132c40;
    }
  }
  goto LAB_00133520;
joined_r0x00132e60:
  if (uVar1 == 3) {
    if (local_2b8.reducedMatrixR_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
        .indexToRow_._M_h._M_buckets
        [local_2b8.reducedMatrixR_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_2b8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               .indexToRow_._M_h._M_buckets
               [local_2b8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x00132eb7;
    }
    goto LAB_00133514;
  }
  p_Var2 = p_Var2->_M_nxt;
  if ((p_Var2 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
     (ulong)uVar1 % local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar16))
  goto LAB_00133514;
  goto joined_r0x00132e60;
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (uint)((ulong)uVar1 %
               local_2b8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               .indexToRow_._M_h._M_bucket_count) ==
         (uint)(local_2b8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1)))) {
joined_r0x00132eb7:
    if (uVar1 == 1) {
      p_00 = (pointer)(p_Var2 + 5);
      goto LAB_00132eea;
    }
  }
  goto LAB_00133514;
  while( true ) {
    if (p_00 == (pointer)0x0) goto LAB_00133544;
    if (p_00->rowIndex_ == *(ID_index *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_00132eea:
    p_00 = (pointer)(p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p_00 == (pointer)(p_Var2 + 5)) goto LAB_00132f1d;
  }
  plVar4 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar5 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar5->next_ = plVar4;
  plVar4->prev_ = plVar5;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
  ::destroy((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
             *)p_Var2[4]._M_nxt,p_00);
LAB_00132f1d:
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_330,0x270);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
  if (local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var2 = p_Var2->_M_nxt;
      if ((p_Var2 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar16))
      goto LAB_0013352c;
    }
    if (local_2b8.reducedMatrixR_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
        .indexToRow_._M_h._M_buckets
        [local_2b8.reducedMatrixR_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_2b8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               .indexToRow_._M_h._M_buckets
               [local_2b8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x00132fd6;
    }
  }
  goto LAB_0013352c;
joined_r0x00133289:
  if (uVar1 == 3) {
    if (local_2b8.reducedMatrixR_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
        .indexToRow_._M_h._M_buckets
        [local_2b8.reducedMatrixR_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_2b8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               .indexToRow_._M_h._M_buckets
               [local_2b8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x001332e0;
    }
    goto LAB_00133538;
  }
  p_Var2 = p_Var2->_M_nxt;
  if ((p_Var2 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
     (ulong)uVar1 % local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar16))
  goto LAB_00133538;
  goto joined_r0x00133289;
joined_r0x001332e0:
  if (uVar1 == 1) {
    p_Var15 = p_Var2 + 5;
    goto LAB_00133313;
  }
  p_Var3 = p_Var3->_M_nxt;
  if ((p_Var3 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
     (uint)((ulong)uVar1 %
           local_2b8.reducedMatrixR_.
           super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
           .indexToRow_._M_h._M_bucket_count) !=
     (uint)(local_2b8.reducedMatrixR_.
            super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
            .indexToRow_._M_h._M_bucket_count != 1))) {
LAB_00133538:
    std::__throw_out_of_range("_Map_base::at");
  }
  goto joined_r0x001332e0;
  while( true ) {
    if (p_Var15 == (_Hash_node_base *)0x0) goto LAB_00133544;
    if (*(int *)&p_Var15[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_00132c73:
    p_Var15 = p_Var15->_M_nxt;
    if (p_Var15 == p_Var2 + 5) break;
  }
  sStack_430.pi_ = (sp_counted_base *)0x0;
  local_428 = "!m.is_zero_entry(3, 1)";
  local_420 = "";
  local_410 = 0;
  local_418 = &PTR__lazy_ostream_00231438;
  local_408 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_400 = &local_428;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_430);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_300,0x26e);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar7,0);
  if (local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_430.pi_ = (sp_counted_base *)0x0;
        local_428 = "!m.is_zero_column(3)";
        local_420 = "";
        local_410 = 0;
        local_418 = &PTR__lazy_ostream_00231438;
        local_408 = &boost::unit_test::lazy_ostream::inst;
        local_320 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_318 = "";
        local_400 = &local_428;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_430);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
        uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
        if (local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_00133514;
        p_Var2 = local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x00132e60;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar16));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var15 == (_Hash_node_base *)0x0) goto LAB_00133544;
    if (*(int *)&p_Var15[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_00133009:
    p_Var15 = p_Var15->_M_nxt;
    if (p_Var15 == p_Var2 + 5) break;
  }
  sStack_430.pi_ = (sp_counted_base *)0x0;
  local_428 = "m.is_zero_entry(3, 1)";
  local_420 = "";
  local_410 = 0;
  local_418 = &PTR__lazy_ostream_00231438;
  local_408 = &boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_400 = &local_428;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_430);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_360,0x271);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar10,0);
  if (local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_430.pi_ = (sp_counted_base *)0x0;
        local_428 = "!m.is_zero_column(3)";
        local_420 = "";
        local_410 = 0;
        local_418 = &PTR__lazy_ostream_00231438;
        local_408 = &boost::unit_test::lazy_ostream::inst;
        local_380 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_378 = "";
        local_400 = &local_428;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_430);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
        uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
        if (local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_00133514;
        p_Var2 = local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x001331f3;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar16));
  }
  std::__throw_out_of_range("_Map_base::at");
LAB_00133313:
  do {
    p_Var15 = p_Var15->_M_nxt;
    if (p_Var15 == p_Var2 + 5) break;
    if (p_Var15 == (_Hash_node_base *)0x0) {
LAB_00133544:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (*(int *)&p_Var15[2]._M_nxt != *(int *)((long)&p_Var3[1]._M_nxt + 4));
  sStack_430.pi_ = (sp_counted_base *)0x0;
  local_428 = "m.is_zero_entry(3, 1)";
  local_420 = "";
  local_410 = 0;
  local_418 = &PTR__lazy_ostream_00231438;
  local_408 = &boost::unit_test::lazy_ostream::inst;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a8 = "";
  local_400 = &local_428;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_430);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c0,0x274);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar13,0);
  if (local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_430.pi_ = (sp_counted_base *)0x0;
        local_428 = "m.is_zero_column(3)";
        local_420 = "";
        local_410 = 0;
        local_418 = &PTR__lazy_ostream_00231438;
        local_408 = &boost::unit_test::lazy_ostream::inst;
        local_3e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_3d8 = "";
        local_400 = &local_428;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_430);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
        ::reset(&local_2b8,(Column_settings *)local_2c0);
        ppVar14 = local_2c0;
        if (local_2c0 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_2c0);
        }
        operator_delete(ppVar14,0x38);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
        ::~RU_matrix(&local_2b8);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_3f8);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar16));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (uint)((ulong)uVar1 %
               local_2b8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               .indexToRow_._M_h._M_bucket_count) ==
         (uint)(local_2b8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1)))) {
joined_r0x00132fd6:
    if (uVar1 == 1) {
      p_Var15 = p_Var2 + 5;
      goto LAB_00133009;
    }
  }
LAB_0013352c:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar16))) {
joined_r0x001331f3:
    if (uVar1 == 3) {
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
      ::
      clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>::Delete_disposer>
                ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                  *)(p_Var2 + 5),
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
                  *)(p_Var2 + 2));
      local_390 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_388 = "";
      local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_398 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_390,0x273);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_2b8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
      uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar12,0);
      if (local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] ==
          (__node_base_ptr)0x0) goto LAB_00133538;
      p_Var2 = local_2b8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
      goto joined_r0x00133289;
    }
  }
LAB_00133514:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (uint)((ulong)uVar1 %
               local_2b8.reducedMatrixR_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               .indexToRow_._M_h._M_bucket_count) ==
         (uint)(local_2b8.reducedMatrixR_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                .indexToRow_._M_h._M_bucket_count != 1)))) {
joined_r0x00132c40:
    if (uVar1 == 1) {
      p_Var15 = p_Var2 + 5;
      goto LAB_00132c73;
    }
  }
LAB_00133520:
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}